

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void load_extensions(MOJOSHADER_glGetProcAddress lookup,void *d)

{
  char ch_00;
  int iVar1;
  char *pcVar2;
  GLubyte *str_00;
  bool bVar3;
  char *pcStack_40;
  char ch;
  char *ext;
  char *str_1;
  GLint num_exts;
  GLint i;
  char *str;
  StringCache *exts;
  void *d_local;
  MOJOSHADER_glGetProcAddress lookup_local;
  
  exts = (StringCache *)d;
  d_local = lookup;
  str = (char *)stringcache_create(ctx->malloc_fn,ctx->free_fn,ctx->malloc_data);
  if ((StringCache *)str == (StringCache *)0x0) {
    out_of_memory();
  }
  else {
    ctx->have_core_opengl = 1;
    ctx->have_opengl_2 = 1;
    ctx->have_opengl_3 = 1;
    ctx->have_GL_ARB_vertex_program = 1;
    ctx->have_GL_ARB_fragment_program = 1;
    ctx->have_GL_NV_vertex_program2_option = 1;
    ctx->have_GL_NV_fragment_program2 = 1;
    ctx->have_GL_NV_vertex_program3 = 1;
    ctx->have_GL_NV_gpu_program4 = 1;
    ctx->have_GL_ARB_shader_objects = 1;
    ctx->have_GL_ARB_vertex_shader = 1;
    ctx->have_GL_ARB_fragment_shader = 1;
    ctx->have_GL_ARB_shading_language_100 = 1;
    ctx->have_GL_NV_half_float = 1;
    ctx->have_GL_ARB_half_float_vertex = 1;
    ctx->have_GL_OES_vertex_half_float = 1;
    ctx->have_GL_ARB_instanced_arrays = 1;
    lookup_entry_points((MOJOSHADER_glGetProcAddress)d_local,exts);
    if (ctx->have_core_opengl == 0) {
      set_error("missing basic OpenGL entry points");
    }
    else {
      _num_exts = (*ctx->glGetString)(0x1f02);
      pcVar2 = strstr((char *)_num_exts,"OpenGL ES ");
      if (pcVar2 != (char *)0x0) {
        ctx->have_opengl_es = 1;
        _num_exts = _num_exts + 10;
      }
      parse_opengl_version_str((char *)_num_exts,&ctx->opengl_major,&ctx->opengl_minor);
      if ((ctx->have_opengl_3 == 0) || (iVar1 = opengl_version_atleast(3,0), iVar1 == 0)) {
        ext = (char *)(*ctx->glGetString)(0x1f03);
        ctx->have_opengl_3 = 0;
        while( true ) {
          bVar3 = false;
          if (*ext != '\0') {
            iVar1 = iswhitespace(*ext);
            bVar3 = iVar1 != 0;
          }
          if (!bVar3) break;
          ext = ext + 1;
        }
        pcStack_40 = ext;
        while( true ) {
          while ((ch_00 = *ext, ch_00 != '\0' && (iVar1 = iswhitespace(ch_00), iVar1 == 0))) {
            ext = ext + 1;
          }
          if ((ext != pcStack_40) &&
             (pcVar2 = stringcache_len((StringCache *)str,pcStack_40,(int)ext - (int)pcStack_40),
             pcVar2 == (char *)0x0)) break;
          if (ch_00 == '\0') goto LAB_00108ad3;
          do {
            ext = ext + 1;
            bVar3 = false;
            if (*ext != '\0') {
              iVar1 = iswhitespace(*ext);
              bVar3 = iVar1 != 0;
            }
          } while (bVar3);
          pcStack_40 = ext;
        }
        out_of_memory();
      }
      else {
        str_1._0_4_ = 0;
        (*ctx->glGetIntegerv)(0x821d,(GLint *)&str_1);
        for (str_1._4_4_ = 0; pcVar2 = str, (int)str_1._4_4_ < (int)str_1;
            str_1._4_4_ = str_1._4_4_ + 1) {
          str_00 = (*ctx->glGetStringi)(0x1f03,str_1._4_4_);
          pcVar2 = stringcache((StringCache *)pcVar2,(char *)str_00);
          if (pcVar2 == (char *)0x0) {
            out_of_memory();
          }
        }
      }
    }
LAB_00108ad3:
    if ((ctx->have_opengl_2 != 0) && (iVar1 = opengl_version_atleast(2,0), iVar1 == 0)) {
      ctx->have_opengl_2 = 0;
      ctx->glUniform1i = ctx->glUniform1iARB;
      ctx->glUniform4fv = ctx->glUniform4fvARB;
      ctx->glUniform4iv = ctx->glUniform4ivARB;
      ctx->glDisableVertexAttribArray = ctx->glDisableVertexAttribArrayARB;
      ctx->glEnableVertexAttribArray = ctx->glEnableVertexAttribArrayARB;
      ctx->glVertexAttribPointer = ctx->glVertexAttribPointerARB;
    }
    iVar1 = verify_extension("GL_ARB_vertex_program",ctx->have_GL_ARB_vertex_program,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_vertex_program = iVar1;
    iVar1 = verify_extension("GL_ARB_fragment_program",ctx->have_GL_ARB_fragment_program,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_fragment_program = iVar1;
    iVar1 = verify_extension("GL_ARB_shader_objects",ctx->have_GL_ARB_shader_objects,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_shader_objects = iVar1;
    iVar1 = verify_extension("GL_ARB_vertex_shader",ctx->have_GL_ARB_vertex_shader,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_vertex_shader = iVar1;
    iVar1 = verify_extension("GL_ARB_fragment_shader",ctx->have_GL_ARB_fragment_shader,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_fragment_shader = iVar1;
    iVar1 = verify_extension("GL_ARB_shading_language_100",ctx->have_GL_ARB_shading_language_100,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_ARB_shading_language_100 = iVar1;
    iVar1 = verify_extension("GL_NV_vertex_program2_option",ctx->have_GL_NV_vertex_program2_option,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_NV_vertex_program2_option = iVar1;
    iVar1 = verify_extension("GL_NV_fragment_program2",ctx->have_GL_NV_fragment_program2,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_NV_fragment_program2 = iVar1;
    iVar1 = verify_extension("GL_NV_vertex_program3",ctx->have_GL_NV_vertex_program3,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_NV_vertex_program3 = iVar1;
    iVar1 = verify_extension("GL_NV_half_float",ctx->have_GL_NV_half_float,(StringCache *)str,-1,-1)
    ;
    ctx->have_GL_NV_half_float = iVar1;
    iVar1 = verify_extension("GL_ARB_half_float_vertex",ctx->have_GL_ARB_half_float_vertex,
                             (StringCache *)str,3,0);
    ctx->have_GL_ARB_half_float_vertex = iVar1;
    iVar1 = verify_extension("GL_OES_vertex_half_float",ctx->have_GL_OES_vertex_half_float,
                             (StringCache *)str,-1,-1);
    ctx->have_GL_OES_vertex_half_float = iVar1;
    iVar1 = verify_extension("GL_ARB_instanced_arrays",ctx->have_GL_ARB_instanced_arrays,
                             (StringCache *)str,3,3);
    ctx->have_GL_ARB_instanced_arrays = iVar1;
    stringcache_destroy((StringCache *)str);
    detect_glsl_version();
  }
  return;
}

Assistant:

static void load_extensions(MOJOSHADER_glGetProcAddress lookup, void *d)
{
    StringCache *exts = stringcache_create(ctx->malloc_fn, ctx->free_fn, ctx->malloc_data);
    if (!exts)
    {
        out_of_memory();
        return;
    } // if

    ctx->have_core_opengl = 1;
    ctx->have_opengl_2 = 1;
    ctx->have_opengl_3 = 1;
    ctx->have_GL_ARB_vertex_program = 1;
    ctx->have_GL_ARB_fragment_program = 1;
    ctx->have_GL_NV_vertex_program2_option = 1;
    ctx->have_GL_NV_fragment_program2 = 1;
    ctx->have_GL_NV_vertex_program3 = 1;
    ctx->have_GL_NV_gpu_program4 = 1;
    ctx->have_GL_ARB_shader_objects = 1;
    ctx->have_GL_ARB_vertex_shader = 1;
    ctx->have_GL_ARB_fragment_shader = 1;
    ctx->have_GL_ARB_shading_language_100 = 1;
    ctx->have_GL_NV_half_float = 1;
    ctx->have_GL_ARB_half_float_vertex = 1;
    ctx->have_GL_OES_vertex_half_float = 1;
    ctx->have_GL_ARB_instanced_arrays = 1;

    lookup_entry_points(lookup, d);

    if (!ctx->have_core_opengl)
        set_error("missing basic OpenGL entry points");
    else
    {
        const char *str = (const char *) ctx->glGetString(GL_VERSION);
        if (strstr(str, "OpenGL ES "))
        {
            ctx->have_opengl_es = 1;
            str += 10;
        }
        parse_opengl_version_str(str, &ctx->opengl_major, &ctx->opengl_minor);

        if ((ctx->have_opengl_3) && (opengl_version_atleast(3, 0)))
        {
            GLint i;
            GLint num_exts = 0;
            ctx->glGetIntegerv(GL_NUM_EXTENSIONS, &num_exts);
            for (i = 0; i < num_exts; i++)
            {
                if (!stringcache(exts, (const char *) ctx->glGetStringi(GL_EXTENSIONS, i)))
                    out_of_memory();
            } // for
        } // if
        else
        {
            const char *str = (const char *) ctx->glGetString(GL_EXTENSIONS);
            const char *ext;
            ctx->have_opengl_3 = 0;

            while (*str && iswhitespace(*str))
                str++;
            ext = str;

            while (1)
            {
                const char ch = *str;
                if (ch && (!iswhitespace(ch)))
                {
                    str++;
                    continue;
                } // else if

                if (str != ext)
                {
                    if (!stringcache_len(exts, ext, (unsigned int) (str - ext)))
                    {
                        out_of_memory();
                        break;
                    } // if
                } // if

                if (ch == '\0')
                    break;

                str++;
                while (*str && iswhitespace(*str))
                    str++;
                ext = str;
            } // while
        } // else
    } // else

    if ((ctx->have_opengl_2) && (!opengl_version_atleast(2, 0)))
    {
        ctx->have_opengl_2 = 0;  // Not GL2! must have the ARB extensions!

        // Force compatible ARB function pointers in...this keeps the code
        //  cleaner when they are identical, so we don't have to if/else
        //  every function call, but we definitely have the right entry
        //  point. Be careful what you add here.
        // These may be NULL, btw.
        ctx->glUniform1i = ctx->glUniform1iARB;
        ctx->glUniform4fv = ctx->glUniform4fvARB;
        ctx->glUniform4iv = ctx->glUniform4ivARB;
        ctx->glDisableVertexAttribArray = ctx->glDisableVertexAttribArrayARB;
        ctx->glEnableVertexAttribArray = ctx->glEnableVertexAttribArrayARB;
        ctx->glVertexAttribPointer = ctx->glVertexAttribPointerARB;
    } // if

    #define VERIFY_EXT(ext, major, minor) \
        ctx->have_##ext = verify_extension(#ext, ctx->have_##ext, exts, major, minor)

    VERIFY_EXT(GL_ARB_vertex_program, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_program, -1, -1);
    VERIFY_EXT(GL_ARB_shader_objects, -1, -1);
    VERIFY_EXT(GL_ARB_vertex_shader, -1, -1);
    VERIFY_EXT(GL_ARB_fragment_shader, -1, -1);
    VERIFY_EXT(GL_ARB_shading_language_100, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program2_option, -1, -1);
    VERIFY_EXT(GL_NV_fragment_program2, -1, -1);
    VERIFY_EXT(GL_NV_vertex_program3, -1, -1);
    VERIFY_EXT(GL_NV_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_half_float_vertex, 3, 0);
    VERIFY_EXT(GL_OES_vertex_half_float, -1, -1);
    VERIFY_EXT(GL_ARB_instanced_arrays, 3, 3);

    #undef VERIFY_EXT

    stringcache_destroy(exts);

    detect_glsl_version();
}